

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O0

void __thiscall OpenMD::RigidBody::updateAtoms(RigidBody *this)

{
  size_type sVar1;
  reference ppAVar2;
  long in_RDI;
  RotMat3x3d a;
  Vector3d pos;
  DirectionalAtom *dAtom;
  Vector3d apos;
  Vector3d ref;
  uint i;
  Vector<double,_3U> *in_stack_fffffffffffffe58;
  Vector<double,_3U> *in_stack_fffffffffffffe60;
  value_type in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  SquareMatrix3<double> *in_stack_fffffffffffffe90;
  SquareMatrix3<double> *in_stack_fffffffffffffe98;
  undefined1 local_130 [80];
  Vector3d *in_stack_ffffffffffffff20;
  StuntDouble *in_stack_ffffffffffffff28;
  uint local_c;
  
  Vector3<double>::Vector3((Vector3<double> *)0x3b1439);
  Vector3<double>::Vector3((Vector3<double> *)0x3b1446);
  StuntDouble::getPos(&in_stack_fffffffffffffe68->super_StuntDouble);
  StuntDouble::getA(&in_stack_fffffffffffffe68->super_StuntDouble);
  for (local_c = 0;
      sVar1 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::size
                        ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x128)
                        ), local_c < sVar1; local_c = local_c + 1) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               (in_RDI + 0x158),(ulong)local_c);
    StuntDouble::body2Lab(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffe60,
               (Vector3<double> *)in_stack_fffffffffffffe58);
    OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x128),
               (ulong)local_c);
    StuntDouble::setPos((StuntDouble *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70)
                        ,(Vector3d *)in_stack_fffffffffffffe68);
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x128),
               (ulong)local_c);
    in_stack_fffffffffffffe77 = Atom::isDirectional((Atom *)0x3b156f);
    if ((bool)in_stack_fffffffffffffe77) {
      ppAVar2 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                          ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                           (in_RDI + 0x128),(ulong)local_c);
      in_stack_fffffffffffffe68 = *ppAVar2;
      if (in_stack_fffffffffffffe68 == (value_type)0x0) {
        in_stack_fffffffffffffe58 = (Vector<double,_3U> *)0x0;
      }
      else {
        in_stack_fffffffffffffe58 =
             (Vector<double,_3U> *)
             __dynamic_cast(in_stack_fffffffffffffe68,&Atom::typeinfo,&DirectionalAtom::typeinfo,0);
      }
      in_stack_fffffffffffffe60 = in_stack_fffffffffffffe58;
      std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
      operator[]((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                  *)(in_RDI + 0x170),(ulong)local_c);
      SquareMatrix3<double>::transpose(in_stack_fffffffffffffe98);
      OpenMD::operator*(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      (**(code **)((long)((Vector<double,_3U> *)in_stack_fffffffffffffe58->data_)->data_[0] + 0x18))
                (in_stack_fffffffffffffe58,local_130);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3b1668);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3b1672);
    }
  }
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3b16d9);
  return;
}

Assistant:

void RigidBody::updateAtoms() {
    unsigned int i;
    Vector3d ref;
    Vector3d apos;
    DirectionalAtom* dAtom;
    Vector3d pos = getPos();
    RotMat3x3d a = getA();

    for (i = 0; i < atoms_.size(); i++) {
      ref = body2Lab(refCoords_[i]);

      apos = pos + ref;

      atoms_[i]->setPos(apos);

      if (atoms_[i]->isDirectional()) {
        dAtom = dynamic_cast<DirectionalAtom*>(atoms_[i]);
        dAtom->setA(refOrients_[i].transpose() * a);
      }
    }
  }